

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.cpp
# Opt level: O0

void __thiscall
miniros::master::Master::Master(Master *this,shared_ptr<miniros::RPCManager> *manager)

{
  undefined8 uVar1;
  RPCManagerPtr *in_RSI;
  undefined4 *in_RDI;
  bool enabled;
  shared_ptr<miniros::RPCManager> *in_stack_ffffffffffffff28;
  LogLocation *in_stack_ffffffffffffff30;
  LogLocation *in_stack_ffffffffffffff40;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffff48;
  Level in_stack_ffffffffffffff50;
  Level in_stack_ffffffffffffff54;
  Level LVar2;
  string *name;
  RegistrationManager *in_stack_ffffffffffffff60;
  LogLocation *loc;
  RegistrationManager *regManager;
  RegistrationManager *regManager_00;
  MasterHandler *this_00;
  undefined1 local_51 [33];
  
  *in_RDI = 0xffffffff;
  this_00 = (MasterHandler *)(in_RDI + 2);
  ::std::__cxx11::string::string((string *)this_00);
  ::std::shared_ptr<miniros::RPCManager>::shared_ptr((shared_ptr<miniros::RPCManager> *)0x526080);
  RegistrationManager::RegistrationManager(in_stack_ffffffffffffff60);
  regManager = (RegistrationManager *)(in_RDI + 0x98);
  regManager_00 = (RegistrationManager *)&stack0xffffffffffffffd0;
  ::std::shared_ptr<miniros::RPCManager>::shared_ptr
            ((shared_ptr<miniros::RPCManager> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28)
  ;
  MasterHandler::MasterHandler(this_00,in_RSI,regManager_00);
  ::std::shared_ptr<miniros::RPCManager>::~shared_ptr((shared_ptr<miniros::RPCManager> *)0x5260e3);
  loc = (LogLocation *)(in_RDI + 0xe8);
  ParameterStorage::ParameterStorage((ParameterStorage *)regManager_00,regManager);
  ::std::shared_ptr<miniros::RPCManager>::operator=
            ((shared_ptr<miniros::RPCManager> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28)
  ;
  LVar2 = (Level)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  ::std::__cxx11::string::operator=((string *)(in_RDI + 2),"localhost");
  *in_RDI = 0x2c2f;
  if (((console::g_initialized ^ 0xff) & 1) != 0) {
    console::initialize();
  }
  if (((Master::loc.initialized_ ^ 0xffU) & 1) != 0) {
    name = (string *)local_51;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)regManager_00,
               (char *)regManager,(allocator<char> *)loc);
    console::initializeLogLocation(loc,name,in_stack_ffffffffffffff54);
    ::std::__cxx11::string::~string((string *)(local_51 + 1));
    ::std::allocator<char>::~allocator((allocator<char> *)local_51);
  }
  if (Master::loc.level_ != Warn) {
    console::setLogLocationLevel(in_stack_ffffffffffffff30,LVar2);
    console::checkLogLocationEnabled(in_stack_ffffffffffffff40);
  }
  LVar2 = in_stack_ffffffffffffff54 & 0xffffff;
  if ((Master::loc.logger_enabled_ & 1U) != 0) {
    LVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffff54);
  }
  if ((char)(LVar2 >> 0x18) != '\0') {
    in_stack_ffffffffffffff48 = (anon_class_8_1_8991fb9c *)Master::loc.logger_;
    in_stack_ffffffffffffff50 = Master::loc.level_;
    uVar1 = ::std::__cxx11::string::c_str();
    console::print((FilterBase *)0x0,in_stack_ffffffffffffff48,
                   (Level)(ulong)in_stack_ffffffffffffff50,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/master.cpp"
                   ,0x17,"miniros::master::Master::Master(std::shared_ptr<RPCManager>)",
                   "Invalid XMLRPC uri. Using ROS_MASTER_URI=http://%s:%d",uVar1,*in_RDI);
  }
  ::std::
  function<void(std::shared_ptr<miniros::master::NodeRef>const&,std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const*)>
  ::operator=((function<void_(const_std::shared_ptr<miniros::master::NodeRef>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_XmlRpc::XmlRpcValue_*)>
               *)CONCAT44(LVar2,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48);
  return;
}

Assistant:

Master::Master(std::shared_ptr<RPCManager> manager)
  : m_handler(manager, &m_regManager), m_parameterStorage(&m_regManager)
{
  m_rpcManager = manager;
  // TODO: Read environment.
  // split the URI (if it's valid) into host and port
  // if (!network.splitURI(ROS.ROS_MASTER_URI, ref _host, ref _port))
  {
    m_host = "localhost";
    m_port = 11311;
    MINIROS_WARN("Invalid XMLRPC uri. Using ROS_MASTER_URI=http://%s:%d", m_host.c_str(), m_port);
  }

  m_parameterStorage.paramUpdateFn =
    [this] (const std::shared_ptr<NodeRef>& nr, const std::string& fullPath, const RpcValue* value) {
      this->m_handler.sendToNode(nr, "paramUpdate", fullPath, value ? *value : RpcValue::Dict());
    };
}